

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O0

void __thiscall
MultiAgentDecisionProcessDiscrete::SoftPrint_abi_cxx11_(MultiAgentDecisionProcessDiscrete *this)

{
  MultiAgentDecisionProcessDiscrete *in_stack_00000298;
  
  SoftPrint_abi_cxx11_(in_stack_00000298);
  return;
}

Assistant:

string MultiAgentDecisionProcessDiscrete::SoftPrint() const
{
    stringstream ss;

    ss << MultiAgentDecisionProcess::SoftPrint();
    ss << _m_S.SoftPrint();
    ss << _m_A.SoftPrint();
    ss << _m_O.SoftPrint();   
   
    if(_m_initialized)
    {
        ss << "Transition model: " << endl;
        ss << _m_p_tModel->SoftPrint();
        ss << "Observation model: " << endl;
        ss << _m_p_oModel->SoftPrint();
    }
    return(ss.str());
}